

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O3

AMQP_VALUE messaging_delivery_received(uint32_t section_number,uint64_t section_offset)

{
  RECEIVED_HANDLE received;
  AMQP_VALUE pAVar1;
  LOGGER_LOG p_Var2;
  
  received = received_create(section_number,section_offset);
  if (received == (RECEIVED_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      pAVar1 = (AMQP_VALUE)0x0;
    }
    else {
      pAVar1 = (AMQP_VALUE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                ,"messaging_delivery_received",0x6f,1,"Cannot create RECEIVED delivery state handle"
               );
    }
  }
  else {
    pAVar1 = amqpvalue_create_received(received);
    if (pAVar1 == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                  ,"messaging_delivery_received",0x77,1,
                  "Cannot create RECEIVED delivery state AMQP value");
      }
    }
    received_destroy(received);
  }
  return pAVar1;
}

Assistant:

AMQP_VALUE messaging_delivery_received(uint32_t section_number, uint64_t section_offset)
{
    AMQP_VALUE result;
    RECEIVED_HANDLE received = received_create(section_number, section_offset);
    if (received == NULL)
    {
        LogError("Cannot create RECEIVED delivery state handle");
        result = NULL;
    }
    else
    {
        result = amqpvalue_create_received(received);
        if (result == NULL)
        {
            LogError("Cannot create RECEIVED delivery state AMQP value");
        }
        else
        {
            /* all ok */
        }

        received_destroy(received);
    }

    return result;
}